

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

Vec_Int_t * Vec_IntSplitHalf(Vec_Int_t *vVec)

{
  int iVar1;
  Vec_Int_t *p;
  int local_20;
  int i;
  int Entry;
  Vec_Int_t *vPart;
  Vec_Int_t *vVec_local;
  
  iVar1 = Vec_IntSize(vVec);
  if (iVar1 < 2) {
    __assert_fail("Vec_IntSize(vVec) > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x134,"Vec_Int_t *Vec_IntSplitHalf(Vec_Int_t *)");
  }
  iVar1 = Vec_IntSize(vVec);
  p = Vec_IntAlloc(iVar1 / 2 + 1);
  local_20 = Vec_IntSize(vVec);
  for (local_20 = local_20 / 2; iVar1 = Vec_IntSize(vVec), local_20 < iVar1; local_20 = local_20 + 1
      ) {
    iVar1 = Vec_IntEntry(vVec,local_20);
    Vec_IntPush(p,iVar1);
  }
  iVar1 = Vec_IntSize(vVec);
  Vec_IntShrink(vVec,iVar1 / 2);
  return p;
}

Assistant:

static Vec_Int_t * Vec_IntSplitHalf( Vec_Int_t * vVec )
{
    Vec_Int_t * vPart;
    int Entry, i;
    assert( Vec_IntSize(vVec) > 1 );
    vPart = Vec_IntAlloc( Vec_IntSize(vVec) / 2 + 1 );
    Vec_IntForEachEntryStart( vVec, Entry, i, Vec_IntSize(vVec) / 2 )
        Vec_IntPush( vPart, Entry );
    Vec_IntShrink( vVec, Vec_IntSize(vVec) / 2 );
    return vPart;
}